

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode CONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  dohdata *pdVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_f8;
  char *local_e8;
  char *auth;
  CHUNKcode CStack_c0;
  _Bool proxy;
  CURLcode extra_1;
  CHUNKcode r_1;
  int writetype;
  ssize_t tookcareof;
  CURLcode extra;
  CHUNKcode r;
  ssize_t gotbytes;
  char *pcStack_98;
  int error;
  char *hostheader;
  char *pcStack_88;
  _Bool ipv6_ip;
  char *http;
  char *useragent;
  char *proxyconn;
  char *host;
  Curl_send_buffer *req_buffer;
  char *host_port;
  timediff_t check;
  http_connect_state *s;
  curl_socket_t tunnelsocket;
  CURLcode result;
  SingleRequest *k;
  Curl_easy *data;
  int subversion;
  int remote_port_local;
  char *hostname_local;
  connectdata *pcStack_18;
  int sockindex_local;
  connectdata *conn_local;
  
  data._0_4_ = 0;
  k = (SingleRequest *)conn->data;
  _tunnelsocket = &((Curl_easy *)k)->req;
  s._0_4_ = conn->sock[sockindex];
  check = (timediff_t)conn->connect_state;
  data._4_4_ = remote_port;
  _subversion = hostname;
  hostname_local._4_4_ = sockindex;
  pcStack_18 = conn;
  _Var2 = Curl_connect_complete(conn);
  if (_Var2) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    *(uint *)&(pcStack_18->bits).field_0x4 = *(uint *)&(pcStack_18->bits).field_0x4 & 0xfeffffff;
    do {
      if (*(int *)(check + 0x4020) == 0) {
        Curl_infof((Curl_easy *)k,"Establish HTTP proxy tunnel to %s:%d\n",_subversion,
                   (ulong)data._4_4_);
        (*Curl_cfree)(*(void **)((k->doh).probe[0].dohbuffer + 0xa4));
        pdVar1 = &k->doh;
        pdVar1->probe[0].dohbuffer[0xa4] = '\0';
        pdVar1->probe[0].dohbuffer[0xa5] = '\0';
        pdVar1->probe[0].dohbuffer[0xa6] = '\0';
        pdVar1->probe[0].dohbuffer[0xa7] = '\0';
        pdVar1->probe[0].dohbuffer[0xa8] = '\0';
        pdVar1->probe[0].dohbuffer[0xa9] = '\0';
        pdVar1->probe[0].dohbuffer[0xaa] = '\0';
        pdVar1->probe[0].dohbuffer[0xab] = '\0';
        host = (char *)Curl_add_buffer_init();
        if ((Curl_send_buffer *)host == (Curl_send_buffer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        req_buffer = (Curl_send_buffer *)curl_maprintf("%s:%d",_subversion,(ulong)data._4_4_);
        if (req_buffer == (Curl_send_buffer *)0x0) {
          Curl_add_buffer_free((Curl_send_buffer **)&host);
          return CURLE_OUT_OF_MEMORY;
        }
        s._4_4_ = Curl_http_output_auth(pcStack_18,"CONNECT",(char *)req_buffer,true);
        (*Curl_cfree)(req_buffer);
        if (s._4_4_ == CURLE_OK) {
          proxyconn = (char *)0x0;
          useragent = "";
          http = "";
          pcStack_88 = "1.1";
          if ((pcStack_18->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
            pcStack_88 = "1.0";
          }
          hostheader._7_1_ = (*(uint *)&(pcStack_18->bits).field_0x4 >> 10 & 1) != 0;
          if (_subversion != (pcStack_18->host).name) {
            pcVar5 = strchr(_subversion,0x3a);
            hostheader._7_1_ = pcVar5 != (char *)0x0;
          }
          pcVar5 = "";
          if ((bool)hostheader._7_1_ != false) {
            pcVar5 = "[";
          }
          pcVar6 = "";
          if ((bool)hostheader._7_1_ != false) {
            pcVar6 = "]";
          }
          pcStack_98 = curl_maprintf("%s%s%s:%d",pcVar5,_subversion,pcVar6,(ulong)data._4_4_);
          if (pcStack_98 == (char *)0x0) {
            Curl_add_buffer_free((Curl_send_buffer **)&host);
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar5 = Curl_checkProxyheaders(pcStack_18,"Host");
          if ((pcVar5 == (char *)0x0) &&
             (proxyconn = curl_maprintf("Host: %s\r\n",pcStack_98), proxyconn == (char *)0x0)) {
            (*Curl_cfree)(pcStack_98);
            Curl_add_buffer_free((Curl_send_buffer **)&host);
            return CURLE_OUT_OF_MEMORY;
          }
          pcVar5 = Curl_checkProxyheaders(pcStack_18,"Proxy-Connection");
          if (pcVar5 == (char *)0x0) {
            useragent = "Proxy-Connection: Keep-Alive\r\n";
          }
          pcVar5 = Curl_checkProxyheaders(pcStack_18,"User-Agent");
          if ((pcVar5 == (char *)0x0) && (*(long *)(k[2].doh.probe[0].dohbuffer + 0x144) != 0)) {
            http = (pcStack_18->allocptr).uagent;
          }
          if (proxyconn == (char *)0x0) {
            local_e8 = "";
          }
          else {
            local_e8 = proxyconn;
          }
          if ((pcStack_18->allocptr).proxyuserpwd == (char *)0x0) {
            local_f8 = "";
          }
          else {
            local_f8 = (pcStack_18->allocptr).proxyuserpwd;
          }
          s._4_4_ = Curl_add_bufferf((Curl_send_buffer **)&host,"CONNECT %s HTTP/%s\r\n%s%s%s%s",
                                     pcStack_98,pcStack_88,local_e8,local_f8,http,useragent);
          if (proxyconn != (char *)0x0) {
            (*Curl_cfree)(proxyconn);
          }
          (*Curl_cfree)(pcStack_98);
          if (s._4_4_ == CURLE_OK) {
            s._4_4_ = Curl_add_custom_headers(pcStack_18,true,(Curl_send_buffer *)host);
          }
          if (s._4_4_ == CURLE_OK) {
            s._4_4_ = Curl_add_bufferf((Curl_send_buffer **)&host,"\r\n");
          }
          if (s._4_4_ == CURLE_OK) {
            s._4_4_ = Curl_add_buffer_send
                                ((Curl_send_buffer **)&host,pcStack_18,
                                 (curl_off_t *)&k[4].start100.tv_usec,0,hostname_local._4_4_);
          }
          host = (char *)0x0;
          if (s._4_4_ != CURLE_OK) {
            Curl_failf((Curl_easy *)k,"Failed sending CONNECT to proxy");
          }
        }
        Curl_add_buffer_free((Curl_send_buffer **)&host);
        if (s._4_4_ != CURLE_OK) {
          return s._4_4_;
        }
        *(undefined4 *)(check + 0x4020) = 1;
        *(undefined4 *)(check + 0x4000) = 0;
      }
      host_port = (char *)Curl_timeleft((Curl_easy *)k,(curltime *)0x0,true);
      if ((long)host_port < 1) {
        Curl_failf((Curl_easy *)k,"Proxy CONNECT aborted due to timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      _Var2 = Curl_conn_data_pending(pcStack_18,hostname_local._4_4_);
      if (!_Var2) {
        return CURLE_OK;
      }
      gotbytes._4_4_ = 0;
      do {
        while( true ) {
          while( true ) {
            if (*(int *)(check + 0x4004) == 0) goto LAB_0015ac75;
            if (check + 0x4000U <= *(ulong *)(check + 0x4010)) {
              Curl_failf((Curl_easy *)k,"CONNECT response too large!");
              return CURLE_RECV_ERROR;
            }
            s._4_4_ = Curl_read(pcStack_18,(curl_socket_t)s,*(char **)(check + 0x4010),1,
                                (ssize_t *)&extra);
            if (s._4_4_ == CURLE_AGAIN) {
              return CURLE_OK;
            }
            iVar3 = Curl_pgrsUpdate(pcStack_18);
            if (iVar3 != 0) {
              return CURLE_ABORTED_BY_CALLBACK;
            }
            if (s._4_4_ != CURLE_OK) {
              *(undefined4 *)(check + 0x4004) = 0;
              goto LAB_0015ac75;
            }
            if (_extra < 1) {
              if ((*(long *)(k[1].doh.probe[0].dohbuffer + 0x14) == 0) ||
                 (*(long *)(k[3].doh.probe[0].dohbuffer + 0xfc) == 0)) {
                gotbytes._4_4_ = 1;
                Curl_failf((Curl_easy *)k,"Proxy CONNECT aborted");
              }
              else {
                *(uint *)&(pcStack_18->bits).field_0x4 =
                     *(uint *)&(pcStack_18->bits).field_0x4 & 0xfeffffff | 0x1000000;
                Curl_infof((Curl_easy *)k,"Proxy CONNECT connection closed\n");
              }
              *(undefined4 *)(check + 0x4004) = 0;
              goto LAB_0015ac75;
            }
            if (1 < *(int *)(check + 0x4004)) break;
            *(int *)(check + 0x4000) = *(int *)(check + 0x4000) + 1;
            if (**(char **)(check + 0x4010) == '\n') {
              s._4_4_ = CURLE_OK;
              if ((*(ulong *)(k[2].doh.probe[1].dohbuffer + 0x10c) >> 0x1e & 1) != 0) {
                Curl_debug((Curl_easy *)k,CURLINFO_HEADER_IN,*(char **)(check + 0x4008),
                           (long)*(int *)(check + 0x4000));
              }
              if ((*(ulong *)(k[2].doh.probe[1].dohbuffer + 0x10c) >> 0x31 & 1) == 0) {
                extra_1 = CURLE_FAILED_INIT;
                if ((*(ulong *)(k[2].doh.probe[1].dohbuffer + 0x10c) >> 0x19 & 1) != 0) {
                  extra_1 = CURLE_URL_MALFORMAT;
                }
                CVar4 = Curl_client_write(pcStack_18,extra_1,*(char **)(check + 0x4008),
                                          (long)*(int *)(check + 0x4000));
                if (CVar4 != CURLE_OK) {
                  return CVar4;
                }
                s._4_4_ = CURLE_OK;
              }
              k[4].start100.tv_sec = (long)*(int *)(check + 0x4000) + k[4].start100.tv_sec;
              k->protop = (void *)((long)*(int *)(check + 0x4000) + (long)k->protop);
              if ((**(char **)(check + 0x4008) == '\r') || (**(char **)(check + 0x4008) == '\n')) {
                *(timediff_t *)(check + 0x4010) = check;
                if ((_tunnelsocket->httpcode == 0x197) &&
                   ((*(ushort *)((long)&k[4].deductheadercount + 4) >> 5 & 1) == 0)) {
                  *(undefined4 *)(check + 0x4004) = 2;
                  if (*(long *)(check + 0x4018) == 0) {
                    if ((*(byte *)(check + 0x4024) & 1) == 0) {
                      *(undefined4 *)(check + 0x4004) = 0;
                    }
                    else {
                      Curl_infof((Curl_easy *)k,"Ignore chunked response-body\n");
                      *(ushort *)&_tunnelsocket->field_0x570 =
                           *(ushort *)&_tunnelsocket->field_0x570 & 0xfff7 | 8;
                      if (*(char *)(*(long *)(check + 0x4008) + 1) == '\n') {
                        *(long *)(check + 0x4008) = *(long *)(check + 0x4008) + 1;
                      }
                      CStack_c0 = Curl_httpchunk_read(pcStack_18,
                                                      (char *)(*(long *)(check + 0x4008) + 1),1,
                                                      (ssize_t *)&extra,
                                                      (CURLcode *)((long)&auth + 4));
                      if (CStack_c0 == CHUNKE_STOP) {
                        Curl_infof((Curl_easy *)k,"chunk reading DONE\n");
                        *(undefined4 *)(check + 0x4004) = 0;
                        *(undefined4 *)(check + 0x4020) = 2;
                      }
                    }
                  }
                  else {
                    Curl_infof((Curl_easy *)k,"Ignore %ld bytes of response-body\n",
                               *(undefined8 *)(check + 0x4018));
                  }
                }
                else {
                  *(undefined4 *)(check + 0x4004) = 0;
                }
                if (*(long *)(check + 0x4018) == 0) {
                  *(undefined4 *)(check + 0x4020) = 2;
                }
              }
              else {
                *(undefined1 *)(*(long *)(check + 0x4008) + (long)*(int *)(check + 0x4000)) = 0;
                iVar3 = curl_strnequal("WWW-Authenticate:",*(char **)(check + 0x4008),0x11);
                if (((iVar3 == 0) || (_tunnelsocket->httpcode != 0x191)) &&
                   ((iVar3 = curl_strnequal("Proxy-authenticate:",*(char **)(check + 0x4008),0x13),
                    iVar3 == 0 || (_tunnelsocket->httpcode != 0x197)))) {
                  iVar3 = curl_strnequal("Content-Length:",*(char **)(check + 0x4008),0xf);
                  if (iVar3 == 0) {
                    _Var2 = Curl_compareheader(*(char **)(check + 0x4008),"Connection:","close");
                    if (_Var2) {
                      *(byte *)(check + 0x4024) = *(byte *)(check + 0x4024) & 0xfd | 2;
                    }
                    else {
                      iVar3 = curl_strnequal("Transfer-Encoding:",*(char **)(check + 0x4008),0x12);
                      if (iVar3 == 0) {
                        _Var2 = Curl_compareheader(*(char **)(check + 0x4008),"Proxy-Connection:",
                                                   "close");
                        if (_Var2) {
                          *(byte *)(check + 0x4024) = *(byte *)(check + 0x4024) & 0xfd | 2;
                        }
                        else {
                          iVar3 = __isoc99_sscanf(*(undefined8 *)(check + 0x4008),"HTTP/1.%d %d",
                                                  &data,&_tunnelsocket->httpcode);
                          if (iVar3 == 2) {
                            *(int *)((long)&k[4].p + 4) = _tunnelsocket->httpcode;
                          }
                        }
                      }
                      else if (_tunnelsocket->httpcode / 100 == 2) {
                        Curl_infof((Curl_easy *)k,
                                   "Ignoring Transfer-Encoding in CONNECT %03d response\n",
                                   (ulong)(uint)_tunnelsocket->httpcode);
                      }
                      else {
                        _Var2 = Curl_compareheader(*(char **)(check + 0x4008),"Transfer-Encoding:",
                                                   "chunked");
                        if (_Var2) {
                          Curl_infof((Curl_easy *)k,"CONNECT responded chunked\n");
                          *(byte *)(check + 0x4024) = *(byte *)(check + 0x4024) & 0xfe | 1;
                          Curl_httpchunk_init(pcStack_18);
                        }
                      }
                    }
                  }
                  else if (_tunnelsocket->httpcode / 100 == 2) {
                    Curl_infof((Curl_easy *)k,"Ignoring Content-Length in CONNECT %03d response\n",
                               (ulong)(uint)_tunnelsocket->httpcode);
                  }
                  else {
                    curlx_strtoofft((char *)(*(long *)(check + 0x4008) + 0xf),(char **)0x0,10,
                                    (curl_off_t *)(check + 0x4018));
                  }
                }
                else {
                  auth._3_1_ = _tunnelsocket->httpcode == 0x197;
                  pcVar5 = Curl_copy_header_value(*(char **)(check + 0x4008));
                  if (pcVar5 == (char *)0x0) {
                    return CURLE_OUT_OF_MEMORY;
                  }
                  s._4_4_ = Curl_http_input_auth(pcStack_18,(_Bool)(auth._3_1_ & 1),pcVar5);
                  (*Curl_cfree)(pcVar5);
                  if (s._4_4_ != CURLE_OK) {
                    return s._4_4_;
                  }
                }
                *(undefined4 *)(check + 0x4000) = 0;
                *(timediff_t *)(check + 0x4010) = check;
                *(undefined8 *)(check + 0x4008) = *(undefined8 *)(check + 0x4010);
              }
            }
            else {
              *(long *)(check + 0x4010) = *(long *)(check + 0x4010) + 1;
            }
          }
          *(timediff_t *)(check + 0x4010) = check;
          if (*(long *)(check + 0x4018) != 0) break;
          _r_1 = 0;
          tookcareof._4_4_ =
               Curl_httpchunk_read(pcStack_18,*(char **)(check + 0x4010),1,(ssize_t *)&r_1,
                                   (CURLcode *)&tookcareof);
          if (tookcareof._4_4_ == CHUNKE_STOP) {
            Curl_infof((Curl_easy *)k,"chunk reading DONE\n");
            *(undefined4 *)(check + 0x4004) = 0;
            *(undefined4 *)(check + 0x4020) = 2;
          }
        }
        *(long *)(check + 0x4018) = *(long *)(check + 0x4018) + -1;
      } while (0 < *(long *)(check + 0x4018));
      *(undefined4 *)(check + 0x4004) = 0;
      *(undefined4 *)(check + 0x4020) = 2;
LAB_0015ac75:
      iVar3 = Curl_pgrsUpdate(pcStack_18);
      if (iVar3 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
      if (gotbytes._4_4_ != 0) {
        return CURLE_RECV_ERROR;
      }
      if (*(int *)((long)&k[4].p + 4) / 100 != 2) {
        CVar4 = Curl_http_auth_act(pcStack_18);
        if (CVar4 != CURLE_OK) {
          return CVar4;
        }
        if ((*(uint *)&(pcStack_18->bits).field_0x4 & 1) != 0) {
          *(byte *)(check + 0x4024) = *(byte *)(check + 0x4024) & 0xfd | 2;
        }
        s._4_4_ = CURLE_OK;
      }
      if (((*(byte *)(check + 0x4024) >> 1 & 1) != 0) &&
         (*(long *)((k->doh).probe[0].dohbuffer + 0xa4) != 0)) {
        Curl_closesocket(pcStack_18,pcStack_18->sock[hostname_local._4_4_]);
        pcStack_18->sock[hostname_local._4_4_] = -1;
        break;
      }
      if ((*(long *)((k->doh).probe[0].dohbuffer + 0xa4) != 0) && (*(int *)(check + 0x4020) == 2)) {
        connect_init(pcStack_18,true);
      }
    } while (*(long *)((k->doh).probe[0].dohbuffer + 0xa4) != 0);
    if (*(int *)((long)&k[4].p + 4) / 100 == 2) {
      *(undefined4 *)(check + 0x4020) = 2;
      (*Curl_cfree)((pcStack_18->allocptr).proxyuserpwd);
      (pcStack_18->allocptr).proxyuserpwd = (char *)0x0;
      (pcStack_18->allocptr).proxyuserpwd = (char *)0x0;
      k[3].doh.probe[0].dohbuffer[0x104] = k[3].doh.probe[0].dohbuffer[0x104] & 0xfe | 1;
      k[3].doh.probe[0].dohbuffer[0x104] = k[3].doh.probe[0].dohbuffer[0x104] & 0xfd;
      Curl_infof((Curl_easy *)k,"Proxy replied %d to CONNECT request\n",
                 (ulong)*(uint *)((long)&k[4].p + 4));
      *(ushort *)&k[1].keepon = (ushort)k[1].keepon & 0xfff7;
      *(uint *)&(pcStack_18->bits).field_0x4 = *(uint *)&(pcStack_18->bits).field_0x4 & 0xfffdffff;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      if (((*(byte *)(check + 0x4024) >> 1 & 1) == 0) ||
         (*(long *)((k->doh).probe[0].dohbuffer + 0xa4) == 0)) {
        (*Curl_cfree)(*(void **)((k->doh).probe[0].dohbuffer + 0xa4));
        pdVar1 = &k->doh;
        pdVar1->probe[0].dohbuffer[0xa4] = '\0';
        pdVar1->probe[0].dohbuffer[0xa5] = '\0';
        pdVar1->probe[0].dohbuffer[0xa6] = '\0';
        pdVar1->probe[0].dohbuffer[0xa7] = '\0';
        pdVar1->probe[0].dohbuffer[0xa8] = '\0';
        pdVar1->probe[0].dohbuffer[0xa9] = '\0';
        pdVar1->probe[0].dohbuffer[0xaa] = '\0';
        pdVar1->probe[0].dohbuffer[0xab] = '\0';
        Curl_conncontrol(pcStack_18,2);
        Curl_closesocket(pcStack_18,pcStack_18->sock[hostname_local._4_4_]);
        pcStack_18->sock[hostname_local._4_4_] = -1;
      }
      else {
        *(uint *)&(pcStack_18->bits).field_0x4 =
             *(uint *)&(pcStack_18->bits).field_0x4 & 0xfeffffff | 0x1000000;
        Curl_infof((Curl_easy *)k,"Connect me again please\n");
        connect_done(pcStack_18);
      }
      *(undefined4 *)(check + 0x4020) = 0;
      if ((*(uint *)&(pcStack_18->bits).field_0x4 >> 0x18 & 1) == 0) {
        Curl_failf((Curl_easy *)k,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)*(uint *)((k->doh).probe[0].dohbuffer + 0x54));
        conn_local._4_4_ = CURLE_RECV_ERROR;
      }
      else {
        conn_local._4_4_ = CURLE_OK;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode CONNECT(struct connectdata *conn,
                        int sockindex,
                        const char *hostname,
                        int remote_port)
{
  int subversion = 0;
  struct Curl_easy *data = conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  struct http_connect_state *s = conn->connect_state;

#define SELECT_OK      0
#define SELECT_ERROR   1

  if(Curl_connect_complete(conn))
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    timediff_t check;
    if(TUNNEL_INIT == s->tunnel_state) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%d\n",
            hostname, remote_port);

        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
      free(data->req.newurl);
      data->req.newurl = NULL;

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%d", hostname, remote_port);
      if(!host_port) {
        Curl_add_buffer_free(&req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(!result) {
        char *host = NULL;
        const char *proxyconn = "";
        const char *useragent = "";
        const char *http = (conn->http_proxy.proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        bool ipv6_ip = conn->bits.ipv6_ip;
        char *hostheader;

        /* the hostname may be different */
        if(hostname != conn->host.name)
          ipv6_ip = (strchr(hostname, ':') != NULL);
        hostheader = /* host:port with IPv6 support */
          aprintf("%s%s%s:%d", ipv6_ip?"[":"", hostname, ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          Curl_add_buffer_free(&req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            Curl_add_buffer_free(&req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(&req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host?host:"",
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host)
          free(host);
        free(hostheader);

        if(!result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(!result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(&req_buffer, "\r\n");

        if(!result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(&req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_add_buffer_free(&req_buffer);
      if(result)
        return result;

      s->tunnel_state = TUNNEL_CONNECT;
      s->perline = 0;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    if(!Curl_conn_data_pending(conn, sockindex))
      /* return so we'll be called again polling-style */
      return CURLE_OK;

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      int error = SELECT_OK;

      while(s->keepon) {
        ssize_t gotbytes;

        /* make sure we have space to read more data */
        if(s->ptr >= &s->connect_buffer[CONNECT_BUFFER_SIZE]) {
          failf(data, "CONNECT response too large!");
          return CURLE_RECV_ERROR;
        }

        /* Read one byte at a time to avoid a race condition. Wait at most one
           second before looping to ensure continuous pgrsUpdates. */
        result = Curl_read(conn, tunnelsocket, s->ptr, 1, &gotbytes);
        if(result == CURLE_AGAIN)
          /* socket buffer drained, return */
          return CURLE_OK;

        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;

        if(result) {
          s->keepon = FALSE;
          break;
        }
        else if(gotbytes <= 0) {
          if(data->set.proxyauth && data->state.authproxy.avail) {
            /* proxy auth was requested and there was proxy auth available,
               then deem this as "mere" proxy disconnect */
            conn->bits.proxy_connect_closed = TRUE;
            infof(data, "Proxy CONNECT connection closed\n");
          }
          else {
            error = SELECT_ERROR;
            failf(data, "Proxy CONNECT aborted");
          }
          s->keepon = FALSE;
          break;
        }


        if(s->keepon > TRUE) {
          /* This means we are currently ignoring a response-body */

          s->ptr = s->connect_buffer;
          if(s->cl) {
            /* A Content-Length based body: simply count down the counter
               and make sure to break out of the loop when we're done! */
            s->cl--;
            if(s->cl <= 0) {
              s->keepon = FALSE;
              s->tunnel_state = TUNNEL_COMPLETE;
              break;
            }
          }
          else {
            /* chunked-encoded body, so we need to do the chunked dance
               properly to know when the end of the body is reached */
            CHUNKcode r;
            CURLcode extra;
            ssize_t tookcareof = 0;

            /* now parse the chunked piece of data so that we can
               properly tell when the stream ends */
            r = Curl_httpchunk_read(conn, s->ptr, 1, &tookcareof, &extra);
            if(r == CHUNKE_STOP) {
              /* we're done reading chunks! */
              infof(data, "chunk reading DONE\n");
              s->keepon = FALSE;
              /* we did the full CONNECT treatment, go COMPLETE */
              s->tunnel_state = TUNNEL_COMPLETE;
            }
          }
          continue;
        }

        s->perline++; /* amount of bytes in this line so far */

        /* if this is not the end of a header line then continue */
        if(*s->ptr != 0x0a) {
          s->ptr++;
          continue;
        }

        /* convert from the network encoding */
        result = Curl_convert_from_network(data, s->line_start,
                                           (size_t)s->perline);
        /* Curl_convert_from_network calls failf if unsuccessful */
        if(result)
          return result;

        /* output debug if that is requested */
        if(data->set.verbose)
          Curl_debug(data, CURLINFO_HEADER_IN,
                     s->line_start, (size_t)s->perline);

        if(!data->set.suppress_connect_headers) {
          /* send the header to the callback */
          int writetype = CLIENTWRITE_HEADER;
          if(data->set.include_header)
            writetype |= CLIENTWRITE_BODY;

          result = Curl_client_write(conn, writetype,
                                     s->line_start, s->perline);
          if(result)
            return result;
        }

        data->info.header_size += (long)s->perline;
        data->req.headerbytecount += (long)s->perline;

        /* Newlines are CRLF, so the CR is ignored as the line isn't
           really terminated until the LF comes. Treat a following CR
           as end-of-headers as well.*/

        if(('\r' == s->line_start[0]) ||
           ('\n' == s->line_start[0])) {
          /* end of response-headers from the proxy */
          s->ptr = s->connect_buffer;
          if((407 == k->httpcode) && !data->state.authproblem) {
            /* If we get a 407 response code with content length
               when we have no auth problem, we must ignore the
               whole response-body */
            s->keepon = 2;

            if(s->cl) {
              infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                    " bytes of response-body\n", s->cl);
            }
            else if(s->chunked_encoding) {
              CHUNKcode r;
              CURLcode extra;

              infof(data, "Ignore chunked response-body\n");

              /* We set ignorebody true here since the chunked
                 decoder function will acknowledge that. Pay
                 attention so that this is cleared again when this
                 function returns! */
              k->ignorebody = TRUE;

              if(s->line_start[1] == '\n') {
                /* this can only be a LF if the letter at index 0
                   was a CR */
                s->line_start++;
              }

              /* now parse the chunked piece of data so that we can
                 properly tell when the stream ends */
              r = Curl_httpchunk_read(conn, s->line_start + 1, 1, &gotbytes,
                                      &extra);
              if(r == CHUNKE_STOP) {
                /* we're done reading chunks! */
                infof(data, "chunk reading DONE\n");
                s->keepon = FALSE;
                /* we did the full CONNECT treatment, go to COMPLETE */
                s->tunnel_state = TUNNEL_COMPLETE;
              }
            }
            else {
              /* without content-length or chunked encoding, we
                 can't keep the connection alive since the close is
                 the end signal so we bail out at once instead */
              s->keepon = FALSE;
            }
          }
          else
            s->keepon = FALSE;
          if(!s->cl)
            /* we did the full CONNECT treatment, go to COMPLETE */
            s->tunnel_state = TUNNEL_COMPLETE;
          continue;
        }

        s->line_start[s->perline] = 0; /* zero terminate the buffer */
        if((checkprefix("WWW-Authenticate:", s->line_start) &&
            (401 == k->httpcode)) ||
           (checkprefix("Proxy-authenticate:", s->line_start) &&
            (407 == k->httpcode))) {

          bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
          char *auth = Curl_copy_header_value(s->line_start);
          if(!auth)
            return CURLE_OUT_OF_MEMORY;

          result = Curl_http_input_auth(conn, proxy, auth);

          free(auth);

          if(result)
            return result;
        }
        else if(checkprefix("Content-Length:", s->line_start)) {
          if(k->httpcode/100 == 2) {
            /* A client MUST ignore any Content-Length or Transfer-Encoding
               header fields received in a successful response to CONNECT.
               "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
            infof(data, "Ignoring Content-Length in CONNECT %03d response\n",
                  k->httpcode);
          }
          else {
            (void)curlx_strtoofft(s->line_start +
                                  strlen("Content-Length:"), NULL, 10, &s->cl);
          }
        }
        else if(Curl_compareheader(s->line_start, "Connection:", "close"))
          s->close_connection = TRUE;
        else if(checkprefix("Transfer-Encoding:", s->line_start)) {
          if(k->httpcode/100 == 2) {
            /* A client MUST ignore any Content-Length or Transfer-Encoding
               header fields received in a successful response to CONNECT.
               "Successful" described as: 2xx (Successful). RFC 7231 4.3.6 */
            infof(data, "Ignoring Transfer-Encoding in "
                  "CONNECT %03d response\n", k->httpcode);
          }
          else if(Curl_compareheader(s->line_start,
                                     "Transfer-Encoding:", "chunked")) {
            infof(data, "CONNECT responded chunked\n");
            s->chunked_encoding = TRUE;
            /* init our chunky engine */
            Curl_httpchunk_init(conn);
          }
        }
        else if(Curl_compareheader(s->line_start,
                                   "Proxy-Connection:", "close"))
          s->close_connection = TRUE;
        else if(2 == sscanf(s->line_start, "HTTP/1.%d %d",
                            &subversion,
                            &k->httpcode)) {
          /* store the HTTP code from the proxy */
          data->info.httpproxycode = k->httpcode;
        }

        s->perline = 0; /* line starts over here */
        s->ptr = s->connect_buffer;
        s->line_start = s->ptr;
      } /* while there's buffer left and loop is requested */

      if(Curl_pgrsUpdate(conn))
        return CURLE_ABORTED_BY_CALLBACK;

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode/100 != 2) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below */
          s->close_connection = TRUE;
      }

      if(s->close_connection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl && (TUNNEL_COMPLETE == s->tunnel_state)) {
      connect_init(conn, TRUE); /* reinit */
    }

  } while(data->req.newurl);

  if(data->info.httpproxycode/100 != 2) {
    if(s->close_connection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
      connect_done(conn);
    }
    else {
      free(data->req.newurl);
      data->req.newurl = NULL;
      /* failure, close this connection to avoid re-use */
      streamclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    s->tunnel_state = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    failf(data, "Received HTTP code %d from proxy after CONNECT",
          data->req.httpcode);
    return CURLE_RECV_ERROR;
  }

  s->tunnel_state = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;
  data->state.authproxy.multipass = FALSE;

  infof(data, "Proxy replied %d to CONNECT request\n",
        data->info.httpproxycode);
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}